

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall nnad::Matrix<double>::SetElement(Matrix<double> *this,int *i,int *j,double *value)

{
  int iVar1;
  int iVar2;
  allocator<char> local_41;
  string local_40;
  
  if ((*i < 0) || (this->_Lines < *i)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"SetElement: line index out of range.",&local_41);
    Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  iVar1 = *j;
  iVar2 = this->_Columns;
  if (iVar2 < iVar1 || iVar1 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"SetElement: column index out of range.",&local_41);
    Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    iVar2 = this->_Columns;
    iVar1 = *j;
  }
  (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar2 * *i + iVar1] = *value;
  return;
}

Assistant:

void SetElement(int const& i, int const& j, T const& value)
    {
      if (i < 0 || i > _Lines)
        Error("SetElement: line index out of range.");

      if (j < 0 || j > _Columns)
        Error("SetElement: column index out of range.");

      _Matrix[i * _Columns + j] = value;
    }